

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.cpp
# Opt level: O0

bool __thiscall Vector3::equal(Vector3 *this,Vector3 *rhs,double eps)

{
  uint uVar1;
  int iVar2;
  uchar *in_RCX;
  size_t *in_RDX;
  size_t *siglen;
  size_t *siglen_00;
  uchar *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  size_t in_R8;
  undefined1 local_19;
  
  uVar1 = sign(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  local_19 = 0;
  if (uVar1 == 0) {
    uVar1 = sign(in_RDI,in_RSI,siglen,(uchar *)(ulong)uVar1,in_R8);
    local_19 = 0;
    if (uVar1 == 0) {
      iVar2 = sign(in_RDI,in_RSI,siglen_00,(uchar *)(ulong)uVar1,in_R8);
      local_19 = iVar2 != 0 ^ 0xff;
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool Vector3::equal(const Vector3 &rhs, double eps) const {
    return !sign(x - rhs.x, eps) &&
           !sign(y - rhs.y, eps) &&
           !sign(z - rhs.z, eps);
}